

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::ResizeNnodes(ChMatterSPH *this,int newsize)

{
  element_type *peVar1;
  ChCollisionModel *pCVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_38;
  
  iVar3 = (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])();
  SetCollide(this,false);
  std::
  vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>::
  resize(&this->nodes,(long)newsize);
  for (uVar4 = 0; uVar5 = (ulong)uVar4,
      uVar5 < (ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
    std::make_shared<chrono::ChNodeSPH>();
    std::__shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5].
                super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    peVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5].
             super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->container = this;
    (peVar1->variables).user_data = this;
    pCVar2 = peVar1->collision_model;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(this->matsurface).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    local_38 = 0;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (**(code **)((long)pCVar2->_vptr_ChCollisionModel + 0x98))
              (0x3f50624dd2f1a9fc,pCVar2,&local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    (**(code **)((long)((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].
                        super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       collision_model->_vptr_ChCollisionModel + 0x20))();
  }
  SetCollide(this,SUB41(iVar3,0));
  return;
}

Assistant:

void ChMatterSPH::ResizeNnodes(int newsize) {
    bool oldcoll = GetCollide();
    SetCollide(false);  // this will remove old particle coll.models from coll.engine, if previously added

    /*
    for (unsigned int j = 0; j < nodes.size(); j++)
    {
        //delete (nodes[j]);  ***not needed since using shared ptrs
        nodes[j] = 0;
    }
    */
    nodes.resize(newsize);

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j] = chrono_types::make_shared<ChNodeSPH>();

        nodes[j]->SetContainer(this);

        nodes[j]->variables.SetUserData((void*)this);  // UserData unuseful in future cuda solver?
        //((ChCollisionModelBullet*)nodes[j]->collision_model)->SetContactable(nodes[j]);
        nodes[j]->collision_model->AddPoint(matsurface, 0.001);  //***TEST***
        nodes[j]->collision_model->BuildModel();
    }

    SetCollide(oldcoll);  // this will also add particle coll.models to coll.engine, if already in a ChSystem
}